

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeFragmentApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::wait_sync(NegativeTestContext *ctx)

{
  GLsync p_Var1;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  GLsync local_18;
  GLsync sync;
  NegativeTestContext *ctx_local;
  
  sync = (GLsync)ctx;
  local_18 = glu::CallLogWrapper::glFenceSync(&ctx->super_CallLogWrapper,0x9117,0);
  p_Var1 = sync;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if sync is not the name of a sync object.",&local_39);
  NegativeTestContext::beginSection((NegativeTestContext *)p_Var1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glWaitSync((CallLogWrapper *)sync,(GLsync)0x0,0,0xffffffffffffffff);
  NegativeTestContext::expectError((NegativeTestContext *)sync,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)sync);
  p_Var1 = sync;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"GL_INVALID_VALUE is generated if flags is not zero.",&local_71);
  NegativeTestContext::beginSection((NegativeTestContext *)p_Var1,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  glu::CallLogWrapper::glWaitSync((CallLogWrapper *)sync,local_18,0x10,0xffffffffffffffff);
  NegativeTestContext::expectError((NegativeTestContext *)sync,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)sync);
  p_Var1 = sync;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "GL_INVALID_VALUE is generated if timeout is not GL_TIMEOUT_IGNORED.",&local_99);
  NegativeTestContext::beginSection((NegativeTestContext *)p_Var1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::glWaitSync((CallLogWrapper *)sync,local_18,0,0);
  NegativeTestContext::expectError((NegativeTestContext *)sync,0x501);
  NegativeTestContext::endSection((NegativeTestContext *)sync);
  glu::CallLogWrapper::glDeleteSync((CallLogWrapper *)sync,local_18);
  return;
}

Assistant:

void wait_sync (NegativeTestContext& ctx)
{
	GLsync sync = ctx.glFenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if sync is not the name of a sync object.");
	ctx.glWaitSync(0, 0, GL_TIMEOUT_IGNORED);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if flags is not zero.");
	ctx.glWaitSync(sync, 0x0010, GL_TIMEOUT_IGNORED);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if timeout is not GL_TIMEOUT_IGNORED.");
	ctx.glWaitSync(sync, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteSync(sync);
}